

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O0

bool __thiscall irr::gui::CGUIButton::OnEvent(CGUIButton *this,SEvent *event)

{
  bool bVar1;
  uint uVar2;
  EGUI_ELEMENT_TYPE EVar3;
  u32 uVar4;
  int iVar5;
  rect<int> *this_00;
  int *in_RSI;
  IGUIElement *in_RDI;
  SEvent newEvent_1;
  bool wasPressed;
  SEvent newEvent;
  byte local_b1;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 local_98 [4];
  undefined8 local_88;
  undefined4 local_80;
  vector2d<int> local_5c;
  byte local_51;
  undefined4 local_50 [4];
  undefined8 local_40;
  undefined4 local_38;
  int *local_18;
  
  local_18 = in_RSI;
  uVar2 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x12])();
  if ((uVar2 & 1) == 0) {
    bVar1 = IGUIElement::OnEvent
                      (in_RDI,(SEvent *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    return bVar1;
  }
  iVar5 = *local_18;
  if (iVar5 == 0) {
    if (*(IGUIElement **)(local_18 + 2) == in_RDI) {
      if (local_18[6] == 0) {
        if ((in_RDI[1].field_0x136 & 1) == 0) {
          (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x38])(in_RDI,0);
        }
        EVar3 = os::Timer::getTime();
        in_RDI[1].Type = EVar3;
      }
      else if (local_18[6] == 1) {
        EVar3 = os::Timer::getTime();
        in_RDI[1].Type = EVar3;
      }
      else if ((local_18[6] == 2) || (local_18[6] == 3)) {
        uVar4 = os::Timer::getTime();
        *(u32 *)((long)&in_RDI[1].Environment + 4) = uVar4;
      }
    }
  }
  else if (iVar5 == 1) {
    if (local_18[7] == 0) {
      if ((in_RDI[1].field_0x136 & 1) == 0) {
        (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x38])(in_RDI,1);
      }
      return true;
    }
    if (local_18[7] == 3) {
      local_51 = in_RDI[1].field_0x137 & 1;
      this_00 = &in_RDI->AbsoluteClippingRect;
      core::vector2d<int>::vector2d(&local_5c,local_18[2],local_18[3]);
      bVar1 = core::rect<int>::isPointInside(this_00,&local_5c);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if ((in_RDI[1].field_0x136 & 1) == 0) {
          (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x38])(in_RDI,0);
        }
        else {
          (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x38])
                    (in_RDI,(ulong)(((byte)in_RDI[1].field_0x137 ^ 0xff) & 1));
        }
        if (((((in_RDI[1].field_0x136 & 1) == 0) && ((local_51 & 1) != 0)) &&
            (in_RDI->Parent != (IGUIElement *)0x0)) ||
           (((in_RDI[1].field_0x136 & 1) != 0 && ((local_51 & 1) != (in_RDI[1].field_0x137 & 1)))))
        {
          in_RDI[1].field_0x134 = *(byte *)(local_18 + 5) & 1;
          in_RDI[1].field_0x135 = *(byte *)(local_18 + 5) >> 1 & 1;
          local_98[0] = 0;
          local_88 = 0;
          local_80 = 5;
          (*(in_RDI->Parent->super_IEventReceiver)._vptr_IEventReceiver[2])(in_RDI->Parent,local_98)
          ;
        }
        return true;
      }
      if ((in_RDI[1].field_0x136 & 1) == 0) {
        (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x38])(in_RDI,0);
      }
      return true;
    }
  }
  else if (iVar5 == 2) {
    if (((*(byte *)(local_18 + 5) & 1) != 0) && ((local_18[3] == 0xd || (local_18[3] == 0x20)))) {
      if ((in_RDI[1].field_0x136 & 1) == 0) {
        (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x38])(in_RDI,1);
      }
      else {
        (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x38])
                  (in_RDI,(ulong)(((byte)in_RDI[1].field_0x137 ^ 0xff) & 1));
      }
      return true;
    }
    if (((((in_RDI[1].field_0x137 & 1) != 0) && ((in_RDI[1].field_0x136 & 1) == 0)) &&
        ((*(byte *)(local_18 + 5) & 1) != 0)) && (local_18[3] == 0x1b)) {
      (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x38])(in_RDI,0);
      return true;
    }
    if ((((*(byte *)(local_18 + 5) & 1) == 0) && ((in_RDI[1].field_0x137 & 1) != 0)) &&
       ((local_18[3] == 0xd || (local_18[3] == 0x20)))) {
      if ((in_RDI[1].field_0x136 & 1) == 0) {
        (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x38])(in_RDI,0);
      }
      if (in_RDI->Parent != (IGUIElement *)0x0) {
        in_RDI[1].field_0x134 = *(byte *)(local_18 + 5) >> 1 & 1;
        in_RDI[1].field_0x135 = *(byte *)(local_18 + 5) >> 2 & 1;
        local_50[0] = 0;
        local_40 = 0;
        local_38 = 5;
        (*(in_RDI->Parent->super_IEventReceiver)._vptr_IEventReceiver[2])(in_RDI->Parent,local_50);
      }
      return true;
    }
  }
  if (in_RDI->Parent == (IGUIElement *)0x0) {
    local_b1 = 0;
  }
  else {
    iVar5 = (*(in_RDI->Parent->super_IEventReceiver)._vptr_IEventReceiver[2])
                      (in_RDI->Parent,local_18);
    local_b1 = (byte)iVar5;
  }
  return (bool)(local_b1 & 1);
}

Assistant:

bool CGUIButton::OnEvent(const SEvent &event)
{
	if (!isEnabled())
		return IGUIElement::OnEvent(event);

	switch (event.EventType) {
	case EET_KEY_INPUT_EVENT:
		if (event.KeyInput.PressedDown &&
				(event.KeyInput.Key == KEY_RETURN || event.KeyInput.Key == KEY_SPACE)) {
			if (!IsPushButton)
				setPressed(true);
			else
				setPressed(!Pressed);

			return true;
		}
		if (Pressed && !IsPushButton && event.KeyInput.PressedDown && event.KeyInput.Key == KEY_ESCAPE) {
			setPressed(false);
			return true;
		} else if (!event.KeyInput.PressedDown && Pressed &&
				   (event.KeyInput.Key == KEY_RETURN || event.KeyInput.Key == KEY_SPACE)) {

			if (!IsPushButton)
				setPressed(false);

			if (Parent) {
				ClickShiftState = event.KeyInput.Shift;
				ClickControlState = event.KeyInput.Control;

				SEvent newEvent;
				newEvent.EventType = EET_GUI_EVENT;
				newEvent.GUIEvent.Caller = this;
				newEvent.GUIEvent.Element = 0;
				newEvent.GUIEvent.EventType = EGET_BUTTON_CLICKED;
				Parent->OnEvent(newEvent);
			}
			return true;
		}
		break;
	case EET_GUI_EVENT:
		if (event.GUIEvent.Caller == this) {
			if (event.GUIEvent.EventType == EGET_ELEMENT_FOCUS_LOST) {
				if (!IsPushButton)
					setPressed(false);
				FocusTime = os::Timer::getTime();
			} else if (event.GUIEvent.EventType == EGET_ELEMENT_FOCUSED) {
				FocusTime = os::Timer::getTime();
			} else if (event.GUIEvent.EventType == EGET_ELEMENT_HOVERED || event.GUIEvent.EventType == EGET_ELEMENT_LEFT) {
				HoverTime = os::Timer::getTime();
			}
		}
		break;
	case EET_MOUSE_INPUT_EVENT:
		if (event.MouseInput.Event == EMIE_LMOUSE_PRESSED_DOWN) {
			if (!IsPushButton)
				setPressed(true);

			return true;
		} else if (event.MouseInput.Event == EMIE_LMOUSE_LEFT_UP) {
			bool wasPressed = Pressed;

			if (!AbsoluteClippingRect.isPointInside(core::position2d<s32>(event.MouseInput.X, event.MouseInput.Y))) {
				if (!IsPushButton)
					setPressed(false);
				return true;
			}

			if (!IsPushButton)
				setPressed(false);
			else {
				setPressed(!Pressed);
			}

			if ((!IsPushButton && wasPressed && Parent) ||
					(IsPushButton && wasPressed != Pressed)) {
				ClickShiftState = event.MouseInput.Shift;
				ClickControlState = event.MouseInput.Control;

				SEvent newEvent;
				newEvent.EventType = EET_GUI_EVENT;
				newEvent.GUIEvent.Caller = this;
				newEvent.GUIEvent.Element = 0;
				newEvent.GUIEvent.EventType = EGET_BUTTON_CLICKED;
				Parent->OnEvent(newEvent);
			}

			return true;
		}
		break;
	default:
		break;
	}

	return Parent ? Parent->OnEvent(event) : false;
}